

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void arb1_texbem(Context *ctx,int luminance)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t in_RCX;
  size_t in_RDX;
  char regnum_str [16];
  char src [64];
  char dst [64];
  char sampler [64];
  char tmp [64];
  char acStack_148 [16];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  uVar1 = (ctx->dest_arg).regnum;
  get_ARB1_destarg_varname(ctx,local_f8,in_RDX);
  get_ARB1_srcarg_varname(ctx,0,local_138,in_RCX);
  iVar2 = ctx->scratch_registers;
  iVar3 = iVar2 + 1;
  ctx->scratch_registers = iVar3;
  if (ctx->max_scratch_registers <= iVar2) {
    ctx->max_scratch_registers = iVar3;
  }
  snprintf(local_78,0x40,"scratch%d");
  snprintf(acStack_148,0x10,"%u",(ulong)uVar1);
  snprintf(local_b8,0x40,"%s%s","s",acStack_148);
  output_line(ctx,"MUL %s, %s_texbem.xzyw, %s.xyxy;",local_78,local_b8,local_138);
  output_line(ctx,"ADD %s.xy, %s.xzxx, %s.ywxx;",local_78,local_78,local_78);
  output_line(ctx,"ADD %s.xy, %s, %s;",local_78,local_78,local_f8);
  output_line(ctx,"TEX %s, %s, texture[%d], 2D;",local_f8,local_78,(ulong)uVar1);
  if (luminance != 0) {
    output_line(ctx,"MAD %s, %s.zzzz, %s_texbeml.xxxx, %s_texbeml.yyyy;",local_78,local_138,local_b8
                ,local_b8);
    output_line(ctx,"MUL %s, %s, %s;",local_f8,local_f8,local_78);
  }
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void arb1_texbem(Context *ctx, const int luminance)
{
    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    char src[64]; get_ARB1_srcarg_varname(ctx, 0, src, sizeof (src));
    char tmp[64]; allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));
    char sampler[64];
    get_ARB1_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage,
                            sampler, sizeof (sampler));

    output_line(ctx, "MUL %s, %s_texbem.xzyw, %s.xyxy;", tmp, sampler, src);
    output_line(ctx, "ADD %s.xy, %s.xzxx, %s.ywxx;", tmp, tmp, tmp);
    output_line(ctx, "ADD %s.xy, %s, %s;", tmp, tmp, dst);
    output_line(ctx, "TEX %s, %s, texture[%d], 2D;", dst, tmp, stage);

    if (luminance)  // TEXBEML, not just TEXBEM?
    {
        output_line(ctx, "MAD %s, %s.zzzz, %s_texbeml.xxxx, %s_texbeml.yyyy;",
                    tmp, src, sampler, sampler);
        output_line(ctx, "MUL %s, %s, %s;", dst, dst, tmp);
    } // if

    emit_ARB1_dest_modifiers(ctx);
}